

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef.cpp
# Opt level: O0

PFunction * CreateAnonymousFunction(PClass *containingclass,PType *returntype,int flags)

{
  PType **ppPVar1;
  PFunction *pPVar2;
  PPrototype *proto;
  uint *argflags_00;
  PType *local_90;
  FName local_84;
  PFunction *local_80;
  PFunction *sym;
  undefined1 local_70 [4];
  int fflags;
  TArray<FName,_FName> argnames;
  TArray<unsigned_int,_unsigned_int> argflags;
  undefined1 local_40 [8];
  TArray<PType_*,_PType_*> args;
  TArray<PType_*,_PType_*> rets;
  int flags_local;
  PType *returntype_local;
  PClass *containingclass_local;
  
  TArray<PType_*,_PType_*>::TArray((TArray<PType_*,_PType_*> *)&args.Most,1);
  TArray<PType_*,_PType_*>::TArray((TArray<PType_*,_PType_*> *)local_40);
  TArray<unsigned_int,_unsigned_int>::TArray((TArray<unsigned_int,_unsigned_int> *)&argnames.Most);
  TArray<FName,_FName>::TArray((TArray<FName,_FName> *)local_70);
  sym._4_4_ = 2;
  if ((flags & 0xeU) != 0) {
    sym._4_4_ = 6;
  }
  local_90 = returntype;
  if (returntype == (PType *)0x0) {
    local_90 = &TypeError->super_PType;
  }
  ppPVar1 = TArray<PType_*,_PType_*>::operator[]((TArray<PType_*,_PType_*> *)&args.Most,0);
  *ppPVar1 = local_90;
  argflags_00 = &argnames.Most;
  SetImplicitArgs((TArray<PType_*,_PType_*> *)local_40,
                  (TArray<unsigned_int,_unsigned_int> *)argflags_00,(TArray<FName,_FName> *)local_70
                  ,(PStruct *)containingclass,sym._4_4_,flags);
  pPVar2 = (PFunction *)DObject::operator_new((DObject *)0x40,(size_t)argflags_00);
  FName::FName(&local_84,NAME_None);
  PFunction::PFunction(pPVar2,(PStruct *)containingclass,&local_84);
  local_80 = pPVar2;
  proto = NewPrototype((TArray<PType_*,_PType_*> *)&args.Most,(TArray<PType_*,_PType_*> *)local_40);
  PFunction::AddVariant
            (pPVar2,proto,(TArray<unsigned_int,_unsigned_int> *)&argnames.Most,
             (TArray<FName,_FName> *)local_70,(VMFunction *)0x0,sym._4_4_,flags);
  pPVar2 = local_80;
  TArray<FName,_FName>::~TArray((TArray<FName,_FName> *)local_70);
  TArray<unsigned_int,_unsigned_int>::~TArray((TArray<unsigned_int,_unsigned_int> *)&argnames.Most);
  TArray<PType_*,_PType_*>::~TArray((TArray<PType_*,_PType_*> *)local_40);
  TArray<PType_*,_PType_*>::~TArray((TArray<PType_*,_PType_*> *)&args.Most);
  return pPVar2;
}

Assistant:

PFunction *CreateAnonymousFunction(PClass *containingclass, PType *returntype, int flags)
{
	TArray<PType *> rets(1);
	TArray<PType *> args;
	TArray<uint32_t> argflags;
	TArray<FName> argnames;

	// Functions that only get flagged for actors do not need the additional two context parameters.
	int fflags = (flags& (SUF_OVERLAY | SUF_WEAPON | SUF_ITEM)) ? VARF_Action | VARF_Method : VARF_Method;

	rets[0] = returntype != nullptr? returntype : TypeError;	// Use TypeError as placeholder if we do not know the return type yet.
	SetImplicitArgs(&args, &argflags, &argnames, containingclass, fflags, flags);

	PFunction *sym = new PFunction(containingclass, NAME_None);	// anonymous functions do not have names.
	sym->AddVariant(NewPrototype(rets, args), argflags, argnames, nullptr, fflags, flags);
	return sym;
}